

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

char * ssh2_fingerprint(ssh_key *data,FingerprintType fptype)

{
  strbuf *sb;
  char *pcVar1;
  ptrlen blob_00;
  char *ret;
  strbuf *blob;
  FingerprintType fptype_local;
  ssh_key *data_local;
  
  sb = strbuf_new();
  ssh_key_public_blob(data,sb->binarysink_);
  blob_00 = ptrlen_from_strbuf(sb);
  pcVar1 = ssh2_fingerprint_blob(blob_00,fptype);
  strbuf_free(sb);
  return pcVar1;
}

Assistant:

char *ssh2_fingerprint(ssh_key *data, FingerprintType fptype)
{
    strbuf *blob = strbuf_new();
    ssh_key_public_blob(data, BinarySink_UPCAST(blob));
    char *ret = ssh2_fingerprint_blob(ptrlen_from_strbuf(blob), fptype);
    strbuf_free(blob);
    return ret;
}